

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metacall.c
# Opt level: O0

int metacall_function_parameter_type(void *func,size_t parameter,metacall_value_id *id)

{
  type_id tVar1;
  signature s_00;
  size_t sVar2;
  type t;
  type_id *in_RDX;
  ulong in_RSI;
  function_conflict in_RDI;
  signature s;
  function f;
  
  if (in_RDI != (function_conflict)0x0) {
    s_00 = function_signature(in_RDI);
    sVar2 = signature_count(s_00);
    if (in_RSI < sVar2) {
      t = signature_get_type((signature)in_RDI,(size_t)s_00);
      tVar1 = type_index(t);
      *in_RDX = tVar1;
      return 0;
    }
  }
  *in_RDX = 0x14;
  return 1;
}

Assistant:

int metacall_function_parameter_type(void *func, size_t parameter, enum metacall_value_id *id)
{
	if (func != NULL)
	{
		function f = (function)func;
		signature s = function_signature(f);

		if (parameter < signature_count(s))
		{
			*id = type_index(signature_get_type(s, parameter));

			return 0;
		}
	}

	*id = METACALL_INVALID;

	return 1;
}